

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * __thiscall
tinyusdz::print_layer_metas_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,LayerMetas *metas,uint32_t indent)

{
  string *psVar1;
  bool bVar2;
  ostream *poVar3;
  double *pdVar4;
  Axis *pAVar5;
  bool *pbVar6;
  PlaybackMode *pPVar7;
  bool v;
  uint32_t n;
  uint32_t n_00;
  uint32_t n_01;
  uint32_t n_02;
  Axis v_00;
  uint32_t n_03;
  uint32_t n_04;
  uint32_t n_05;
  uint32_t n_06;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t uVar8;
  uint32_t n_07;
  uint32_t extraout_EDX_01;
  uint32_t n_08;
  uint32_t extraout_EDX_02;
  StringData *v_01;
  StringData *v_02;
  pprint *this_00;
  char *pcVar9;
  allocator local_241;
  string local_240;
  string *local_220;
  string local_218;
  string local_1f8;
  string local_1d8;
  stringstream meta_ss;
  ostream local_1a8 [376];
  
  this_00 = (pprint *)((ulong)metas & 0xffffffff);
  local_220 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)&meta_ss);
  if (*(long *)(this + 0xe10) != 0) {
    pprint::Indent_abi_cxx11_(&local_240,this_00,n);
    poVar3 = std::operator<<(local_1a8,(string *)&local_240);
    poVar3 = std::operator<<(poVar3,"doc = ");
    to_string_abi_cxx11_(&local_218,this + 0xe08,v_01);
    poVar3 = std::operator<<(poVar3,(string *)&local_218);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
  }
  bVar2 = TypedAttributeWithFallback<double>::authored
                    ((TypedAttributeWithFallback<double> *)(this + 600));
  if (bVar2) {
    pprint::Indent_abi_cxx11_(&local_240,this_00,n_00);
    poVar3 = std::operator<<(local_1a8,(string *)&local_240);
    std::operator<<(poVar3,"metersPerUnit = ");
    pdVar4 = TypedAttributeWithFallback<double>::get_value
                       ((TypedAttributeWithFallback<double> *)(this + 600));
    poVar3 = std::ostream::_M_insert<double>(*pdVar4);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::_M_dispose();
  }
  bVar2 = TypedAttributeWithFallback<double>::authored
                    ((TypedAttributeWithFallback<double> *)(this + 0xe38));
  if (bVar2) {
    pprint::Indent_abi_cxx11_(&local_240,this_00,n_01);
    poVar3 = std::operator<<(local_1a8,(string *)&local_240);
    std::operator<<(poVar3,"kilogramsPerUnit = ");
    pdVar4 = TypedAttributeWithFallback<double>::get_value
                       ((TypedAttributeWithFallback<double> *)(this + 0xe38));
    poVar3 = std::ostream::_M_insert<double>(*pdVar4);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::_M_dispose();
  }
  bVar2 = TypedAttributeWithFallback<tinyusdz::Axis>::authored
                    ((TypedAttributeWithFallback<tinyusdz::Axis> *)this);
  if (bVar2) {
    pprint::Indent_abi_cxx11_(&local_240,this_00,n_02);
    poVar3 = std::operator<<(local_1a8,(string *)&local_240);
    poVar3 = std::operator<<(poVar3,"upAxis = ");
    pAVar5 = TypedAttributeWithFallback<tinyusdz::Axis>::get_value
                       ((TypedAttributeWithFallback<tinyusdz::Axis> *)this);
    to_string_abi_cxx11_(&local_1f8,(tinyusdz *)(ulong)*pAVar5,v_00);
    std::__cxx11::string::string((string *)&local_1d8,"\"",&local_241);
    quote(&local_218,&local_1f8,&local_1d8);
    poVar3 = std::operator<<(poVar3,(string *)&local_218);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
  }
  bVar2 = TypedAttributeWithFallback<double>::authored
                    ((TypedAttributeWithFallback<double> *)(this + 0x4a0));
  if (bVar2) {
    pprint::Indent_abi_cxx11_(&local_240,this_00,n_03);
    poVar3 = std::operator<<(local_1a8,(string *)&local_240);
    std::operator<<(poVar3,"timeCodesPerSecond = ");
    pdVar4 = TypedAttributeWithFallback<double>::get_value
                       ((TypedAttributeWithFallback<double> *)(this + 0x4a0));
    poVar3 = std::ostream::_M_insert<double>(*pdVar4);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::_M_dispose();
  }
  bVar2 = TypedAttributeWithFallback<double>::authored
                    ((TypedAttributeWithFallback<double> *)(this + 0x930));
  if (bVar2) {
    pprint::Indent_abi_cxx11_(&local_240,this_00,n_04);
    poVar3 = std::operator<<(local_1a8,(string *)&local_240);
    std::operator<<(poVar3,"startTimeCode = ");
    pdVar4 = TypedAttributeWithFallback<double>::get_value
                       ((TypedAttributeWithFallback<double> *)(this + 0x930));
    poVar3 = std::ostream::_M_insert<double>(*pdVar4);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::_M_dispose();
  }
  bVar2 = TypedAttributeWithFallback<double>::authored
                    ((TypedAttributeWithFallback<double> *)(this + 0xb78));
  if (bVar2) {
    pprint::Indent_abi_cxx11_(&local_240,this_00,n_05);
    poVar3 = std::operator<<(local_1a8,(string *)&local_240);
    std::operator<<(poVar3,"endTimeCode = ");
    pdVar4 = TypedAttributeWithFallback<double>::get_value
                       ((TypedAttributeWithFallback<double> *)(this + 0xb78));
    poVar3 = std::ostream::_M_insert<double>(*pdVar4);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::_M_dispose();
  }
  bVar2 = TypedAttributeWithFallback<double>::authored
                    ((TypedAttributeWithFallback<double> *)(this + 0x6e8));
  uVar8 = n_06;
  if (bVar2) {
    pprint::Indent_abi_cxx11_(&local_240,this_00,n_06);
    poVar3 = std::operator<<(local_1a8,(string *)&local_240);
    std::operator<<(poVar3,"framesPerSecond = ");
    pdVar4 = TypedAttributeWithFallback<double>::get_value
                       ((TypedAttributeWithFallback<double> *)(this + 0x6e8));
    poVar3 = std::ostream::_M_insert<double>(*pdVar4);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::_M_dispose();
    uVar8 = extraout_EDX;
  }
  if (*(long *)(this + 0xdc8) != *(long *)(this + 0xdc0)) {
    pprint::Indent_abi_cxx11_(&local_240,this_00,uVar8);
    poVar3 = std::operator<<(local_1a8,(string *)&local_240);
    poVar3 = std::operator<<(poVar3,"subLayers = ");
    poVar3 = std::operator<<(poVar3,(vector<tinyusdz::SubLayer,_std::allocator<tinyusdz::SubLayer>_>
                                     *)(this + 0xdc0));
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::_M_dispose();
    uVar8 = extraout_EDX_00;
  }
  if (*(long *)(this + 0x240) != 0) {
    pprint::Indent_abi_cxx11_(&local_240,(pprint *)0x1,uVar8);
    poVar3 = std::operator<<(local_1a8,(string *)&local_240);
    poVar3 = std::operator<<(poVar3,"defaultPrim = ");
    std::__cxx11::string::string((string *)&local_1f8,"\"",(allocator *)&local_1d8);
    quote(&local_218,(string *)(this + 0x238),&local_1f8);
    poVar3 = std::operator<<(poVar3,(string *)&local_218);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
  }
  bVar2 = TypedAttributeWithFallback<bool>::authored
                    ((TypedAttributeWithFallback<bool> *)(this + 0x10b0));
  if (bVar2) {
    pprint::Indent_abi_cxx11_(&local_240,(pprint *)0x1,n_07);
    poVar3 = std::operator<<(local_1a8,(string *)&local_240);
    poVar3 = std::operator<<(poVar3,"autoPlay = ");
    pbVar6 = TypedAttributeWithFallback<bool>::get_value
                       ((TypedAttributeWithFallback<bool> *)(this + 0x10b0));
    to_string_abi_cxx11_(&local_218,(tinyusdz *)(ulong)*pbVar6,v);
    poVar3 = std::operator<<(poVar3,(string *)&local_218);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
  }
  bVar2 = TypedAttributeWithFallback<tinyusdz::LayerMetas::PlaybackMode>::authored
                    ((TypedAttributeWithFallback<tinyusdz::LayerMetas::PlaybackMode> *)
                     (this + 0x12d8));
  uVar8 = extraout_EDX_01;
  if (bVar2) {
    pPVar7 = TypedAttributeWithFallback<tinyusdz::LayerMetas::PlaybackMode>::get_value
                       ((TypedAttributeWithFallback<tinyusdz::LayerMetas::PlaybackMode> *)
                        (this + 0x12d8));
    if (*pPVar7 == PlaybackModeLoop) {
      pprint::Indent_abi_cxx11_(&local_240,this_00,n_08);
      poVar3 = std::operator<<(local_1a8,(string *)&local_240);
      pcVar9 = "playbackMode = \"loop\"\n";
    }
    else {
      pprint::Indent_abi_cxx11_(&local_240,this_00,n_08);
      poVar3 = std::operator<<(local_1a8,(string *)&local_240);
      pcVar9 = "playbackMode = \"none\"\n";
    }
    std::operator<<(poVar3,pcVar9);
    std::__cxx11::string::_M_dispose();
    uVar8 = extraout_EDX_02;
  }
  if (*(long *)(this + 0xde0) != 0) {
    pprint::Indent_abi_cxx11_(&local_240,this_00,uVar8);
    poVar3 = std::operator<<(local_1a8,(string *)&local_240);
    to_string_abi_cxx11_(&local_218,this + 0xdd8,v_02);
    poVar3 = std::operator<<(poVar3,(string *)&local_218);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
  }
  if (*(long *)(this + 0x10a8) != 0) {
    std::__cxx11::string::string((string *)&local_218,"customLayerData",(allocator *)&local_1f8);
    print_customData(&local_240,(CustomDataType *)(this + 0x1080),&local_218,1);
    std::operator<<(local_1a8,(string *)&local_240);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
  }
  psVar1 = local_220;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&meta_ss);
  return psVar1;
}

Assistant:

std::string print_layer_metas(const LayerMetas &metas, const uint32_t indent) {
  std::stringstream meta_ss;

  if (metas.doc.value.empty()) {
    // ss << pprint::Indent(1) << "doc = \"Exporterd from TinyUSDZ v" <<
    // tinyusdz::version_major
    //    << "." << tinyusdz::version_minor << "." << tinyusdz::version_micro
    //    << tinyusdz::version_rev << "\"\n";
  } else {
    meta_ss << pprint::Indent(indent) << "doc = " << to_string(metas.doc)
            << "\n";
  }

  if (metas.metersPerUnit.authored()) {
    meta_ss << pprint::Indent(indent)
            << "metersPerUnit = " << metas.metersPerUnit.get_value() << "\n";
  }

  if (metas.kilogramsPerUnit.authored()) {
    meta_ss << pprint::Indent(indent)
            << "kilogramsPerUnit = " << metas.kilogramsPerUnit.get_value() << "\n";
  }

  if (metas.upAxis.authored()) {
    meta_ss << pprint::Indent(indent)
            << "upAxis = " << quote(to_string(metas.upAxis.get_value()))
            << "\n";
  }

  if (metas.timeCodesPerSecond.authored()) {
    meta_ss << pprint::Indent(indent)
            << "timeCodesPerSecond = " << metas.timeCodesPerSecond.get_value()
            << "\n";
  }

  if (metas.startTimeCode.authored()) {
    meta_ss << pprint::Indent(indent)
            << "startTimeCode = " << metas.startTimeCode.get_value() << "\n";
  }

  if (metas.endTimeCode.authored()) {
    meta_ss << pprint::Indent(indent)
            << "endTimeCode = " << metas.endTimeCode.get_value() << "\n";
  }

  if (metas.framesPerSecond.authored()) {
    meta_ss << pprint::Indent(indent)
            << "framesPerSecond = " << metas.framesPerSecond.get_value()
            << "\n";
  }

  // TODO: Do not print subLayers when consumed(after composition evaluated)
  if (metas.subLayers.size()) {
    meta_ss << pprint::Indent(indent) << "subLayers = " << metas.subLayers
            << "\n";
  }

  if (metas.defaultPrim.str().size()) {
    meta_ss << pprint::Indent(1)
            << "defaultPrim = " << tinyusdz::quote(metas.defaultPrim.str())
            << "\n";
  }

  if (metas.autoPlay.authored()) {
    meta_ss << pprint::Indent(1)
            << "autoPlay = " << to_string(metas.autoPlay.get_value()) << "\n";
  }

  if (metas.playbackMode.authored()) {
    auto v = metas.playbackMode.get_value();
    if (v == LayerMetas::PlaybackMode::PlaybackModeLoop) {
      meta_ss << pprint::Indent(indent) << "playbackMode = \"loop\"\n";
    } else {  // None
      meta_ss << pprint::Indent(indent) << "playbackMode = \"none\"\n";
    }
  }

  if (!metas.comment.value.empty()) {
    // Stage meta omits 'comment'
    meta_ss << pprint::Indent(indent) << to_string(metas.comment) << "\n";
  }

  if (metas.customLayerData.size()) {
    meta_ss << print_customData(metas.customLayerData, "customLayerData",
                                /* indent */ 1);
  }

  return meta_ss.str();
}